

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_ftruncate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_io_stream *pjVar1;
  _func_int_void_ptr_jx9_int64 *p_Var2;
  void *pvVar3;
  int iVar4;
  io_private *pDev_00;
  char *pcVar5;
  jx9_int64 jVar6;
  char *local_58;
  int rc;
  io_private *pDev;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 2) || (iVar4 = jx9_value_is_resource(*apArg), iVar4 == 0)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
    jx9_result_bool(pCtx,0);
    return 0;
  }
  pDev_00 = (io_private *)jx9_value_to_resource(*apArg);
  if ((pDev_00 != (io_private *)0x0) && (pDev_00->iMagic == 0xfeac14)) {
    pjVar1 = pDev_00->pStream;
    if ((pjVar1 != (jx9_io_stream *)0x0) && (pjVar1->xTrunc != (_func_int_void_ptr_jx9_int64 *)0x0))
    {
      p_Var2 = pjVar1->xTrunc;
      pvVar3 = pDev_00->pHandle;
      jVar6 = jx9_value_to_int64(apArg[1]);
      iVar4 = (*p_Var2)(pvVar3,jVar6);
      if (iVar4 == 0) {
        ResetIOPrivate(pDev_00);
      }
      jx9_result_bool(pCtx,(uint)(iVar4 == 0));
      return 0;
    }
    pcVar5 = jx9_function_name(pCtx);
    if (pjVar1 == (jx9_io_stream *)0x0) {
      local_58 = "null_stream";
    }
    else {
      local_58 = pjVar1->zName;
    }
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,pcVar5,local_58);
    jx9_result_bool(pCtx,0);
    return 0;
  }
  jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_ftruncate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	int rc;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xTrunc == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	rc = pStream->xTrunc(pDev->pHandle, jx9_value_to_int64(apArg[1]));
	if( rc == JX9_OK ){
		/* Discard buffered data */
		ResetIOPrivate(pDev);
	}
	/* IO result */
	jx9_result_bool(pCtx, rc == JX9_OK);
	return JX9_OK;	
}